

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O3

void __thiscall
proto2_unittest::RecursiveMessage::InternalSwap(RecursiveMessage *this,RecursiveMessage *other)

{
  uint32_t uVar1;
  ulong uVar2;
  ulong uVar3;
  RecursiveMessage *pRVar4;
  void *pvVar5;
  RecursiveMessage *pRVar6;
  ulong uVar7;
  ulong uVar8;
  long __tmp;
  
  uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  uVar7 = uVar2;
  if ((uVar2 & 1) != 0) {
    uVar7 = *(ulong *)(uVar2 & 0xfffffffffffffffe);
  }
  uVar3 = (other->super_MessageLite)._internal_metadata_.ptr_;
  uVar8 = uVar3;
  if ((uVar3 & 1) != 0) {
    uVar8 = *(ulong *)(uVar3 & 0xfffffffffffffffe);
  }
  if (uVar7 == uVar8) {
    (this->super_MessageLite)._internal_metadata_.ptr_ = uVar3;
    (other->super_MessageLite)._internal_metadata_.ptr_ = uVar2;
    uVar1 = (this->field_0)._impl_._has_bits_.has_bits_[0];
    (this->field_0)._impl_._has_bits_.has_bits_[0] = (other->field_0)._impl_._has_bits_.has_bits_[0]
    ;
    (other->field_0)._impl_._has_bits_.has_bits_[0] = uVar1;
    pRVar4 = (this->field_0)._impl_.recurse_;
    pvVar5 = (other->field_0)._impl_.payload_.tagged_ptr_.ptr_;
    pRVar6 = (other->field_0)._impl_.recurse_;
    (other->field_0)._impl_.payload_.tagged_ptr_.ptr_ =
         (this->field_0)._impl_.payload_.tagged_ptr_.ptr_;
    (this->field_0)._impl_.payload_.tagged_ptr_.ptr_ = pvVar5;
    (this->field_0)._impl_.recurse_ = pRVar6;
    (other->field_0)._impl_.recurse_ = pRVar4;
    return;
  }
  InternalSwap();
}

Assistant:

PROTOBUF_ALWAYS_INLINE bool HasUnknownFieldsTag() const {
    return ptr_ & kUnknownFieldsTagMask;
  }